

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

char * get_dir(char *path,char *dest)

{
  char *pcVar1;
  char temp [260];
  char acStack_118 [264];
  
  if (dest != (char *)0x0) {
    strcpy(acStack_118,path);
    pcVar1 = point_basename(acStack_118);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    memset(dest,0,0x104);
    strcpy(dest,acStack_118);
  }
  return dest;
}

Assistant:

char *get_dir(const char *path, char *dest)
{
	if (dest == NULL)
	{
		return NULL;
	}
	char temp[MAX_PATH];
	if (has_driveletter(path))
	{
		strcpy(temp, path + 2);
	}
	else
	{
		strcpy(temp, path);
	}
	char *p = point_basename(temp);
	if (p != NULL)
	{
		*p = '\0';
	}
	clear_path_string(dest, MAX_PATH);
	strcpy(dest, temp);
	return dest;
}